

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NDocSave(xmlDocPtr doc,xmlNodeSetPtr nodes,int mode,xmlChar **inclusive_ns_prefixes,
                  int with_comments,char *filename,int compression)

{
  int iVar1;
  xmlOutputBufferPtr buf;
  
  if (filename == (char *)0x0) {
    xmlC14NErrParam("saving doc");
  }
  else {
    if (compression < 0) {
      compression = xmlGetCompressMode();
    }
    buf = xmlOutputBufferCreateFilename(filename,(xmlCharEncodingHandlerPtr)0x0,compression);
    if (buf == (xmlOutputBufferPtr)0x0) {
      xmlC14NErrInternal("creating temporary filename");
    }
    else {
      iVar1 = xmlC14NDocSaveTo(doc,nodes,mode,inclusive_ns_prefixes,with_comments,buf);
      if (-1 < iVar1) {
        iVar1 = xmlOutputBufferClose(buf);
        return iVar1;
      }
      xmlC14NErrInternal("canonize document to buffer");
      xmlOutputBufferClose(buf);
    }
  }
  return -1;
}

Assistant:

int
xmlC14NDocSave(xmlDocPtr doc, xmlNodeSetPtr nodes,
               int mode, xmlChar ** inclusive_ns_prefixes,
               int with_comments, const char *filename, int compression)
{
    xmlOutputBufferPtr buf;
    int ret;

    if (filename == NULL) {
        xmlC14NErrParam("saving doc");
        return (-1);
    }
#ifdef LIBXML_ZLIB_ENABLED
    if (compression < 0)
        compression = xmlGetCompressMode();
#endif

    /*
     * save the content to a temp buffer, use default UTF8 encoding.
     */
    buf = xmlOutputBufferCreateFilename(filename, NULL, compression);
    if (buf == NULL) {
        xmlC14NErrInternal("creating temporary filename");
        return (-1);
    }

    /*
     * canonize document and write to buffer
     */
    ret = xmlC14NDocSaveTo(doc, nodes, mode, inclusive_ns_prefixes,
                           with_comments, buf);
    if (ret < 0) {
        xmlC14NErrInternal("canonize document to buffer");
        (void) xmlOutputBufferClose(buf);
        return (-1);
    }

    /*
     * get the numbers of bytes written
     */
    ret = xmlOutputBufferClose(buf);
    return (ret);
}